

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
          (DescriptorBuilder *this,Edition edition,Proto *proto,FieldDescriptor *descriptor,
          OptionsType *options,FlatAllocator *alloc,ErrorLocation error_location,bool force_merge)

{
  byte *pbVar1;
  uint uVar2;
  ushort *puVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar4;
  Descriptor *pDVar5;
  FeatureSet **ppFVar6;
  FeatureSet *features;
  MessageLite *pMVar7;
  size_t sVar8;
  FeatureSet *pFVar9;
  undefined1 *from;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *this_00;
  Tables *unaff_R12;
  string_view element_name;
  string_view element_name_00;
  FeatureSet base_features;
  StatusOr<google::protobuf::FeatureSet> merged;
  FeatureSet *local_f8;
  undefined1 local_e0 [80];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *local_90;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_88;
  FeatureSet local_80;
  
  if ((descriptor->field_0x1 & 0x10) == 0) {
    if ((descriptor->field_0x1 & 8) == 0) {
      pDVar5 = descriptor->containing_type_;
    }
    else {
      pDVar5 = (descriptor->scope_).extension_scope;
      if (pDVar5 == (Descriptor *)0x0) {
        ppFVar6 = &descriptor->file_->merged_features_;
        goto LAB_003c6854;
      }
    }
    ppFVar6 = &pDVar5->merged_features_;
  }
  else {
    if ((descriptor->scope_).containing_oneof == (OneofDescriptor *)0x0) {
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    ppFVar6 = &((descriptor->scope_).containing_oneof)->merged_features_;
  }
LAB_003c6854:
  pFVar9 = *ppFVar6;
  from = _FeatureSet_default_instance_;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  if ((this->feature_resolver_).
      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged == false) {
    this_00 = &local_88;
    ResolveFeaturesImpl<google::protobuf::FieldDescriptor>((DescriptorBuilder *)&this_00->status_);
LAB_003c6b68:
    this_00 = *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 **)
               ((ulong)this_00 & 0xfffffffffffffffe);
LAB_003c68aa:
    features = (FeatureSet *)
               Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)&this_00->status_);
    (options->field_0)._impl_.features_ = features;
LAB_003c68b6:
    from = (undefined1 *)DescriptorPool::Tables::InternFeatureSet(unaff_R12,features);
    descriptor->proto_features_ = (FeatureSet *)from;
    pFVar9 = (options->field_0)._impl_.features_;
    if (pFVar9 != (FeatureSet *)0x0) {
      FeatureSet::Clear(pFVar9);
      from = (undefined1 *)descriptor->proto_features_;
    }
    pbVar1 = (byte *)((long)&options->field_0 + 0x18);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  else {
    uVar2 = (options->field_0)._impl_._has_bits_.has_bits_[0];
    features = (options->field_0)._impl_.features_;
    if ((features == (FeatureSet *)0x0 & (byte)uVar2) == 1) {
      internal::protobuf_assumption_failed
                ("!value || _impl_.features_ != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                 ,0x4957);
    }
    local_f8 = pFVar9;
    if ((uVar2 & 1) != 0) {
      unaff_R12 = this->tables_;
      if (features == (FeatureSet *)0x0) {
        this_00 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 *)
                  (options->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)this_00 & 1) != 0) goto LAB_003c6b68;
        goto LAB_003c68aa;
      }
      goto LAB_003c68b6;
    }
  }
  FeatureSet::FeatureSet((FeatureSet *)local_e0,(Arena *)0x0,(FeatureSet *)from);
  if (((int)edition < 1000) &&
     (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_)) {
    puVar3 = (ushort *)(descriptor->all_names_).payload_;
    element_name._M_len = (ulong)*puVar3;
    element_name._M_str = (char *)((long)puVar3 + ~element_name._M_len);
    AddError(this,element_name,&proto->super_Message,error_location,
             "Features are only valid under editions.");
  }
  pMVar7 = internal::ExtensionSet::GetMessage
                     ((ExtensionSet *)(local_e0 + 0x10),pb::cpp,
                      (MessageLite *)PTR__CppFeatures_default_instance__00833388);
  if ((((ulong)pMVar7[1]._vptr_MessageLite & 1) == 0) && ((options->field_0)._impl_.ctype_ == 1)) {
    pMVar7 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)(local_e0 + 0x10),pb::cpp,'\v',
                        (MessageLite *)pb::_CppFeatures_default_instance_,(FieldDescriptor *)0x0);
    bVar4 = internal::ValidateEnum(2,(uint32_t *)&pb::CppFeatures_StringType_internal_data_);
    if (!bVar4) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::pb::CppFeatures_StringType_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/cpp_features.pb.h"
                    ,0x1ac,
                    "void pb::CppFeatures::_internal_set_string_type(::pb::CppFeatures_StringType)")
      ;
    }
    *(undefined4 *)&pMVar7[1]._internal_metadata_.ptr_ = 2;
    *(byte *)&pMVar7[1]._vptr_MessageLite = *(byte *)&pMVar7[1]._vptr_MessageLite | 1;
  }
  if ((int)edition < 1000) {
    if ((proto->field_0)._impl_.label_ == 2) {
      bVar4 = internal::ValidateEnum(3,(uint32_t *)&FeatureSet_FieldPresence_internal_data_);
      if (!bVar4) {
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FeatureSet_FieldPresence_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x5068,
                      "void google::protobuf::FeatureSet::_internal_set_field_presence(::google::protobuf::FeatureSet_FieldPresence)"
                     );
      }
      local_e0._48_4_ = 3;
      local_e0[0x28] = local_e0[0x28] | 1;
    }
    if ((proto->field_0)._impl_.type_ == 10) {
      bVar4 = internal::ValidateEnum(2,(uint32_t *)&FeatureSet_MessageEncoding_internal_data_);
      if (!bVar4) {
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FeatureSet_MessageEncoding_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x50e4,
                      "void google::protobuf::FeatureSet::_internal_set_message_encoding(::google::protobuf::FeatureSet_MessageEncoding)"
                     );
      }
      local_e0._64_4_ = 2;
      local_e0[0x28] = local_e0[0x28] | 0x10;
    }
    if ((options->field_0)._impl_.packed_ == true) {
      bVar4 = internal::ValidateEnum(1,(uint32_t *)&FeatureSet_RepeatedFieldEncoding_internal_data_)
      ;
      if (!bVar4) goto LAB_003c6bc3;
      local_e0._56_4_ = 1;
      local_e0[0x28] = local_e0[0x28] | 4;
    }
    if (((edition == EDITION_PROTO3) && ((*(byte *)((long)&options->field_0 + 0x18) & 8) != 0)) &&
       ((options->field_0)._impl_.packed_ == false)) {
      bVar4 = internal::ValidateEnum(2,(uint32_t *)&FeatureSet_RepeatedFieldEncoding_internal_data_)
      ;
      if (!bVar4) {
LAB_003c6bc3:
        __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FeatureSet_RepeatedFieldEncoding_internal_data_)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x50a6,
                      "void google::protobuf::FeatureSet::_internal_set_repeated_field_encoding(::google::protobuf::FeatureSet_RepeatedFieldEncoding)"
                     );
      }
      local_e0._56_4_ = 2;
      local_e0[0x28] = local_e0[0x28] | 4;
    }
  }
  sVar8 = FeatureSet::ByteSizeLong((FeatureSet *)local_e0);
  if (sVar8 == 0 && !force_merge) {
    descriptor->merged_features_ = local_f8;
  }
  else {
    FeatureResolver::MergeFeatures
              ((StatusOr<google::protobuf::FeatureSet> *)&local_88.status_,
               (FeatureResolver *)&this->feature_resolver_,local_f8,(FeatureSet *)local_e0);
    if (local_88 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
      pFVar9 = DescriptorPool::Tables::InternFeatureSet(this->tables_,&local_80);
      descriptor->merged_features_ = pFVar9;
    }
    else {
      puVar3 = (ushort *)(descriptor->all_names_).payload_;
      element_name_00._M_len = (ulong)*puVar3;
      element_name_00._M_str = (char *)((long)puVar3 + ~element_name_00._M_len);
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>(google::protobuf::Edition,google::protobuf::FieldDescriptor::Proto_const&,google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptor::OptionsType*,google::protobuf::internal::FlatAllocator&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,bool)::_lambda()_1_,std::__cxx11::string>
      ;
      make_error.ptr_.obj = &local_90;
      local_90 = &local_88;
      AddError(this,element_name_00,&proto->super_Message,error_location,make_error);
    }
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::~StatusOrData
              ((StatusOrData<google::protobuf::FeatureSet> *)&local_88.status_);
  }
  FeatureSet::~FeatureSet((FeatureSet *)local_e0);
  return;
}

Assistant:

void DescriptorBuilder::ResolveFeaturesImpl(
    Edition edition, const typename DescriptorT::Proto& proto,
    DescriptorT* descriptor, typename DescriptorT::OptionsType* options,
    internal::FlatAllocator& alloc,
    DescriptorPool::ErrorCollector::ErrorLocation error_location,
    bool force_merge) {
  const FeatureSet& parent_features = GetParentFeatures(descriptor);
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();

  ABSL_CHECK(feature_resolver_.has_value());

  if (options->has_features()) {
    // Remove the features from the child's options proto to avoid leaking
    // internal details.
    descriptor->proto_features_ =
        tables_->InternFeatureSet(std::move(*options->mutable_features()));
    options->clear_features();
  }

  FeatureSet base_features = *descriptor->proto_features_;

  // Handle feature inference from proto2/proto3.
  if (IsLegacyEdition(edition)) {
    if (descriptor->proto_features_ != &FeatureSet::default_instance()) {
      AddError(descriptor->name(), proto, error_location,
               "Features are only valid under editions.");
    }
  }
  InferLegacyProtoFeatures(proto, *options, edition, base_features);

  if (base_features.ByteSizeLong() == 0 && !force_merge) {
    // Nothing to merge, and we aren't forcing it.
    descriptor->merged_features_ = &parent_features;
    return;
  }

  // Calculate the merged features for this target.
  absl::StatusOr<FeatureSet> merged =
      feature_resolver_->MergeFeatures(parent_features, base_features);
  if (!merged.ok()) {
    AddError(descriptor->name(), proto, error_location,
             [&] { return std::string(merged.status().message()); });
    return;
  }

  descriptor->merged_features_ = tables_->InternFeatureSet(*std::move(merged));
}